

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_mstring_get_utf8(archive *a,archive_mstring *aes,char **p)

{
  undefined8 uVar1;
  wchar_t wVar2;
  archive_string_conv *_p;
  archive *in_RDX;
  long in_RSI;
  long in_RDI;
  wchar_t r;
  archive_string_conv *sc;
  archive_string_conv *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  wchar_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if ((*(uint *)(in_RSI + 0x60) & 2) == 0) {
    in_RDX->magic = 0;
    in_RDX->state = 0;
    if ((*(uint *)(in_RSI + 0x60) & 1) == 0) {
      local_4 = L'\0';
    }
    else {
      _p = archive_string_conversion_to_charset
                     (in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      if (_p == (archive_string_conv *)0x0) {
        local_4 = L'\xffffffff';
      }
      else {
        wVar2 = archive_strncpy_l((archive_string *)in_RDX,_p,
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                  in_stack_ffffffffffffffc8);
        if (in_RDI == 0) {
          free_sconv_object((archive_string_conv *)0x112ea4);
        }
        if (wVar2 == L'\0') {
          *(uint *)(in_RSI + 0x60) = *(uint *)(in_RSI + 0x60) | 2;
          uVar1 = *(undefined8 *)(in_RSI + 0x18);
          in_RDX->magic = (int)uVar1;
          in_RDX->state = (int)((ulong)uVar1 >> 0x20);
          local_4 = L'\0';
        }
        else {
          local_4 = L'\xffffffff';
        }
      }
    }
  }
  else {
    uVar1 = *(undefined8 *)(in_RSI + 0x18);
    in_RDX->magic = (int)uVar1;
    in_RDX->state = (int)((ulong)uVar1 >> 0x20);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
archive_mstring_get_utf8(struct archive *a, struct archive_mstring *aes,
  const char **p)
{
	struct archive_string_conv *sc;
	int r;

	/* If we already have a UTF8 form, return that immediately. */
	if (aes->aes_set & AES_SET_UTF8) {
		*p = aes->aes_utf8.s;
		return (0);
	}

	*p = NULL;
	if (aes->aes_set & AES_SET_MBS) {
		sc = archive_string_conversion_to_charset(a, "UTF-8", 1);
		if (sc == NULL)
			return (-1);/* Couldn't allocate memory for sc. */
		r = archive_strncpy_l(&(aes->aes_mbs), aes->aes_mbs.s,
		    aes->aes_mbs.length, sc);
		if (a == NULL)
			free_sconv_object(sc);
		if (r == 0) {
			aes->aes_set |= AES_SET_UTF8;
			*p = aes->aes_utf8.s;
			return (0);/* success. */
		} else
			return (-1);/* failure. */
	}
	return (0);/* success. */
}